

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_parser.cpp
# Opt level: O3

Configuration ParseCmdArgs(int argc,char **argv,int *argc_flags_offset_out)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  undefined8 uVar5;
  int iVar6;
  uint uVar7;
  string flag;
  allocator<char> local_65;
  uint local_64;
  uint local_60;
  uint local_5c;
  int *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  iVar6 = 1;
  local_64 = 0;
  local_60 = 0;
  local_5c = 0;
  uVar7 = 0;
  local_58 = argc_flags_offset_out;
  do {
    if (argc <= iVar6) break;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_50,argv[iVar6],&local_65);
    iVar4 = std::__cxx11::string::compare((char *)local_50);
    if (iVar4 == 0) {
LAB_00104ca2:
      uVar7 = 1;
LAB_00104cc5:
      iVar6 = iVar6 + 1;
      bVar1 = true;
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)local_50);
      if (iVar4 == 0) goto LAB_00104ca2;
      uVar5 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar5 == 0) {
LAB_00104ca9:
        local_5c = (uint)CONCAT71((int7)((ulong)uVar5 >> 8),1);
        goto LAB_00104cc5;
      }
      uVar5 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar5 == 0) goto LAB_00104ca9;
      uVar5 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar5 == 0) {
LAB_00104cb3:
        local_60 = (uint)CONCAT71((int7)((ulong)uVar5 >> 8),1);
        goto LAB_00104cc5;
      }
      uVar5 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar5 == 0) goto LAB_00104cb3;
      uVar5 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar5 == 0) {
LAB_00104cbd:
        local_64 = (uint)CONCAT71((int7)((ulong)uVar5 >> 8),1);
        goto LAB_00104cc5;
      }
      uVar5 = std::__cxx11::string::compare((char *)local_50);
      if ((int)uVar5 == 0) goto LAB_00104cbd;
      bVar1 = false;
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  } while (bVar1);
  uVar2 = local_64;
  if (((iVar6 == argc) && (uVar3 = 1, (local_64 & 1) == 0)) || (uVar3 = uVar7, uVar7 != 0)) {
    uVar7 = uVar3;
    PrintUsage();
  }
  *local_58 = iVar6;
  return (Configuration)(uVar7 | (local_5c & 0xff) << 8 | (local_60 & 0xff) << 0x10 | uVar2 << 0x18)
  ;
}

Assistant:

Configuration ParseCmdArgs(int argc, char **argv, int &argc_flags_offset_out) {
    //executable name should be skipped
    int offset = 1;
    
    Configuration config;
    
    while (offset < argc) {
        std::string flag(argv[offset]);
        if (flag == "--help" || flag == "-h") {
            config.printUsage = true;
            ++offset;
            continue;
        }
        if (flag == "--silent" || flag == "-s") {
            config.silent = true;
            ++offset;
            continue;
        }
        if (flag == "--perf" || flag == "-p") {
            config.measurePerformance = true;
            ++offset;
            continue;
        }
        if (flag == "--interactive" || flag == "-i") {
            config.interactive = true;
            ++offset;
            continue;
        }
        break;
    }
    //usage should be printed when we don't know what to process
    if (argc == offset && !config.interactive) {
        config.printUsage = true;
    }
    if (config.printUsage) PrintUsage();
    
    argc_flags_offset_out = offset;
    return config;
}